

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

int __thiscall CTPNSymBase::has_return_value_on_call(CTPNSymBase *this)

{
  CTcSymbol *pCVar1;
  CTcPrsSymtab *in_RDI;
  CTcSymbol *sym;
  textchar_t *in_stack_ffffffffffffffd8;
  int local_4;
  
  CTcParser::get_global_symtab(G_prs);
  pCVar1 = CTcPrsSymtab::find(in_RDI,in_stack_ffffffffffffffd8,0x2ad7f7);
  if (pCVar1 == (CTcSymbol *)0x0) {
    local_4 = 1;
  }
  else {
    local_4 = (*(pCVar1->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry.
                _vptr_CVmHashEntry[7])();
  }
  return local_4;
}

Assistant:

int CTPNSymBase::has_return_value_on_call() const
{
    CTcSymbol *sym;
    
    /* try resolving my symbol */
    sym = G_prs->get_global_symtab()->find(sym_, len_);

    /* 
     *   if we found a symbol, let it resolve the call; otherwise, assume
     *   that we do have a return value 
     */
    if (sym != 0)
        return sym->has_return_value_on_call();
    else
        return TRUE;
}